

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_value.h
# Opt level: O0

void __thiscall
polyscope::PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue
          (PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this)

{
  undefined4 uVar1;
  vec<3,_float,_(glm::qualifier)0> value_;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *in_RDI;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffff4;
  
  uVar1 = (in_RDI->value).field_1;
  value_.field_1.y = (in_RDI->value).field_2;
  value_.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar1;
  value_.field_2 = in_stack_fffffffffffffff4;
  set(in_RDI,value_);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

~PersistentValue() { set(value); }